

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O1

void __thiscall SM83::ld_a_dde(SM83 *this)

{
  u8 uVar1;
  string_view fmt;
  format_args args;
  ulong local_68 [2];
  ulong local_58;
  ulong local_48;
  ulong local_38;
  ulong local_28;
  ulong local_18;
  
  local_68[0] = (ulong)(this->field_0).af;
  local_58 = (ulong)(this->field_1).bc;
  local_48 = (ulong)(this->field_2).de;
  local_38 = (ulong)(this->field_3).hl;
  local_28 = (ulong)this->sp;
  local_18 = (ulong)this->pc_at_opcode;
  fmt.size_ = 0x48;
  fmt.data_ = "AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  LD A, (DE)\n";
  args.field_1.values_ = (value<fmt::v11::context> *)local_68;
  args.desc_ = 0x222222;
  ::fmt::v11::vprint(fmt,args);
  uVar1 = Bus::Read8(this->bus,(this->field_2).de,true);
  (this->field_0).field_1.a = uVar1;
  return;
}

Assistant:

void SM83::ld_a_dde() {
    LTRACE("LD A, (DE)");
    a = bus.Read8(de);
}